

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_restore(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  CHAR_DATA *pCVar4;
  CHAR_DATA *in_RDI;
  DESCRIPTOR_DATA *d;
  CHAR_DATA *vch;
  CHAR_DATA *victim;
  char buf [4608];
  char arg [4608];
  CHAR_DATA *in_stack_ffffffffffffdb98;
  CHAR_DATA *in_stack_ffffffffffffdba0;
  CHAR_DATA *in_stack_ffffffffffffdba8;
  CHAR_DATA *in_stack_ffffffffffffdbb0;
  DESCRIPTOR_DATA *local_2430;
  CHAR_DATA *local_2428;
  char local_2418 [4608];
  char local_1218 [4];
  int in_stack_ffffffffffffedec;
  long in_stack_ffffffffffffedf0;
  long in_stack_ffffffffffffedf8;
  OBJ_DATA *in_stack_ffffffffffffee00;
  CHAR_DATA *in_stack_ffffffffffffee08;
  char *in_stack_ffffffffffffee10;
  char *in_stack_ffffffffffffffa0;
  CHAR_DATA *in_stack_ffffffffffffffa8;
  
  pcVar3 = one_argument((char *)in_stack_ffffffffffffdba0,(char *)in_stack_ffffffffffffdb98);
  if ((local_1218[0] == '\0') || (bVar1 = str_cmp(local_1218,"room"), !bVar1)) {
    for (local_2428 = in_RDI->in_room->people; local_2428 != (CHAR_DATA *)0x0;
        local_2428 = local_2428->next_in_room) {
      affect_strip(in_stack_ffffffffffffdbb0,(int)((ulong)in_stack_ffffffffffffdba8 >> 0x20));
      affect_strip(in_stack_ffffffffffffdbb0,(int)((ulong)in_stack_ffffffffffffdba8 >> 0x20));
      affect_strip(in_stack_ffffffffffffdbb0,(int)((ulong)in_stack_ffffffffffffdba8 >> 0x20));
      affect_strip(in_stack_ffffffffffffdbb0,(int)((ulong)in_stack_ffffffffffffdba8 >> 0x20));
      affect_strip(in_stack_ffffffffffffdbb0,(int)((ulong)in_stack_ffffffffffffdba8 >> 0x20));
      local_2428->hit = (int)local_2428->max_hit;
      local_2428->mana = local_2428->max_mana;
      local_2428->move = local_2428->max_move;
      bVar1 = is_npc(in_stack_ffffffffffffdb98);
      if (!bVar1) {
        update_pos(in_stack_ffffffffffffdba0);
      }
      act((char *)in_stack_ffffffffffffdbb0,in_stack_ffffffffffffdba8,in_stack_ffffffffffffdba0,
          in_stack_ffffffffffffdb98,0);
    }
    sprintf(local_2418,"$N restored room %d.",(ulong)(uint)(int)in_RDI->in_room->vnum);
    get_trust(in_stack_ffffffffffffdb98);
    wiznet(in_stack_ffffffffffffee10,in_stack_ffffffffffffee08,in_stack_ffffffffffffee00,
           in_stack_ffffffffffffedf8,in_stack_ffffffffffffedf0,in_stack_ffffffffffffedec);
    send_to_char((char *)in_stack_ffffffffffffdbb0,in_stack_ffffffffffffdba8);
  }
  else {
    iVar2 = get_trust(in_stack_ffffffffffffdb98);
    if ((iVar2 < 0x3a) || (bVar1 = str_cmp(local_1218,"all"), bVar1)) {
      pCVar4 = get_char_world(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
      if (pCVar4 == (CHAR_DATA *)0x0) {
        send_to_char((char *)in_stack_ffffffffffffdbb0,in_stack_ffffffffffffdba8);
      }
      else {
        affect_strip(in_stack_ffffffffffffdbb0,(int)((ulong)in_stack_ffffffffffffdba8 >> 0x20));
        affect_strip(in_stack_ffffffffffffdbb0,(int)((ulong)in_stack_ffffffffffffdba8 >> 0x20));
        affect_strip(in_stack_ffffffffffffdbb0,(int)((ulong)in_stack_ffffffffffffdba8 >> 0x20));
        affect_strip(in_stack_ffffffffffffdbb0,(int)((ulong)in_stack_ffffffffffffdba8 >> 0x20));
        affect_strip(in_stack_ffffffffffffdbb0,(int)((ulong)in_stack_ffffffffffffdba8 >> 0x20));
        pCVar4->hit = (int)pCVar4->max_hit;
        pCVar4->mana = pCVar4->max_mana;
        pCVar4->move = pCVar4->max_move;
        bVar1 = is_npc(in_stack_ffffffffffffdb98);
        if (!bVar1) {
          update_pos(in_stack_ffffffffffffdba0);
        }
        act((char *)in_stack_ffffffffffffdbb0,in_stack_ffffffffffffdba8,in_stack_ffffffffffffdba0,
            in_stack_ffffffffffffdb98,0);
        bVar1 = is_npc(in_stack_ffffffffffffdb98);
        if (bVar1) {
          pcVar3 = pCVar4->short_descr;
        }
        else {
          pcVar3 = pCVar4->name;
        }
        sprintf(local_2418,"$N restored %s",pcVar3);
        get_trust(in_stack_ffffffffffffdb98);
        wiznet(in_stack_ffffffffffffee10,in_stack_ffffffffffffee08,in_stack_ffffffffffffee00,
               in_stack_ffffffffffffedf8,in_stack_ffffffffffffedf0,in_stack_ffffffffffffedec);
        send_to_char(pcVar3,in_RDI);
      }
    }
    else {
      for (local_2430 = descriptor_list; local_2430 != (DESCRIPTOR_DATA *)0x0;
          local_2430 = local_2430->next) {
        pCVar4 = local_2430->character;
        if ((pCVar4 != (CHAR_DATA *)0x0) && (bVar1 = is_npc(in_stack_ffffffffffffdb98), !bVar1)) {
          affect_strip(in_stack_ffffffffffffdbb0,(int)((ulong)in_stack_ffffffffffffdba8 >> 0x20));
          affect_strip(in_stack_ffffffffffffdbb0,(int)((ulong)in_stack_ffffffffffffdba8 >> 0x20));
          affect_strip(in_stack_ffffffffffffdbb0,(int)((ulong)in_stack_ffffffffffffdba8 >> 0x20));
          affect_strip(in_stack_ffffffffffffdbb0,(int)((ulong)in_stack_ffffffffffffdba8 >> 0x20));
          affect_strip(in_stack_ffffffffffffdbb0,(int)((ulong)in_stack_ffffffffffffdba8 >> 0x20));
          pCVar4->hit = (int)pCVar4->max_hit;
          pCVar4->mana = pCVar4->max_mana;
          pCVar4->move = pCVar4->max_move;
          bVar1 = is_npc(in_stack_ffffffffffffdb98);
          if (!bVar1) {
            update_pos(in_stack_ffffffffffffdba0);
          }
          if (pCVar4->in_room != (ROOM_INDEX_DATA *)0x0) {
            if ((pcVar3 == (char *)0x0) || (bVar1 = str_cmp(pcVar3,""), !bVar1)) {
              act((char *)in_stack_ffffffffffffdbb0,in_stack_ffffffffffffdba8,
                  in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb98,0);
            }
            else {
              act((char *)in_stack_ffffffffffffdbb0,in_stack_ffffffffffffdba8,
                  in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb98,0);
            }
          }
        }
      }
      send_to_char((char *)in_stack_ffffffffffffdbb0,in_stack_ffffffffffffdba8);
    }
  }
  return;
}

Assistant:

void do_restore(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH], buf[MAX_STRING_LENGTH];
	CHAR_DATA *victim;
	CHAR_DATA *vch;
	DESCRIPTOR_DATA *d;

	argument = one_argument(argument, arg);

	if (arg[0] == '\0' || !str_cmp(arg, "room"))
	{
		/* cure room */

		for (vch = ch->in_room->people; vch != nullptr; vch = vch->next_in_room)
		{
			affect_strip(vch, gsn_plague);
			affect_strip(vch, gsn_poison);
			affect_strip(vch, gsn_blindness);
			affect_strip(vch, gsn_sleep);
			affect_strip(vch, gsn_curse);

			vch->hit = vch->max_hit;
			vch->mana = vch->max_mana;
			vch->move = vch->max_move;

			if (!is_npc(vch))
				update_pos(vch);

			act("$n has restored you.", ch, nullptr, vch, TO_VICT);
		}

		sprintf(buf, "$N restored room %d.", ch->in_room->vnum);
		wiznet(buf, ch, nullptr, WIZ_RESTORE, WIZ_SECURE, get_trust(ch));

		send_to_char("Room restored.\n\r", ch);
		return;
	}

	if (get_trust(ch) >= MAX_LEVEL - 2 && !str_cmp(arg, "all"))
	{
		/* cure all */

		for (d = descriptor_list; d != nullptr; d = d->next)
		{
			victim = d->character;

			if (victim == nullptr || is_npc(victim))
				continue;

			affect_strip(victim, gsn_plague);
			affect_strip(victim, gsn_poison);
			affect_strip(victim, gsn_blindness);
			affect_strip(victim, gsn_sleep);
			affect_strip(victim, gsn_curse);

			victim->hit = victim->max_hit;
			victim->mana = victim->max_mana;
			victim->move = victim->max_move;

			if (!is_npc(victim))
				update_pos(victim);

			if (victim->in_room != nullptr)
			{
				if (!argument || !str_cmp(argument, ""))
					act("$n has restored you.", ch, nullptr, victim, TO_VICT);
				else
					act("$t has restored you.", ch, argument, victim, TO_VICT);
			}
		}

		send_to_char("All active players restored.\n\r", ch);
		return;
	}

	victim = get_char_world(ch, arg);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	affect_strip(victim, gsn_plague);
	affect_strip(victim, gsn_poison);
	affect_strip(victim, gsn_blindness);
	affect_strip(victim, gsn_sleep);
	affect_strip(victim, gsn_curse);

	victim->hit = victim->max_hit;
	victim->mana = victim->max_mana;
	victim->move = victim->max_move;

	if (!is_npc(victim))
		update_pos(victim);

	act("$n has restored you.", ch, nullptr, victim, TO_VICT);

	sprintf(buf, "$N restored %s", is_npc(victim) ? victim->short_descr : victim->name);
	wiznet(buf, ch, nullptr, WIZ_RESTORE, WIZ_SECURE, get_trust(ch));

	send_to_char("Ok.\n\r", ch);
}